

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderProgram.cpp
# Opt level: O2

void __thiscall glu::Program::Program(Program *this,RenderContext *renderCtx)

{
  int iVar1;
  GLuint GVar2;
  GLenum err;
  undefined4 extraout_var;
  
  iVar1 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  this->m_gl = (Functions *)CONCAT44(extraout_var,iVar1);
  this->m_program = 0;
  (this->m_info).infoLog._M_dataplus._M_p = (pointer)&(this->m_info).infoLog.field_2;
  (this->m_info).infoLog._M_string_length = 0;
  (this->m_info).infoLog.field_2._M_local_buf[0] = '\0';
  (this->m_info).linkOk = false;
  (this->m_info).linkTimeUs = 0;
  GVar2 = (*((Functions *)CONCAT44(extraout_var,iVar1))->createProgram)();
  this->m_program = GVar2;
  err = (*this->m_gl->getError)();
  checkError(err,"glCreateProgram()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluShaderProgram.cpp"
             ,0xb4);
  return;
}

Assistant:

Program::Program (const RenderContext& renderCtx)
	: m_gl		(renderCtx.getFunctions())
	, m_program	(0)
{
	m_program = m_gl.createProgram();
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glCreateProgram()");
}